

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_expr.cpp
# Opt level: O2

double __thiscall nivalis::Expr::operator()(Expr *this,Environment *env)

{
  double dVar1;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = detail::eval_ast(env,&this->ast,(vector<double,_std::allocator<double>_> *)&local_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  return dVar1;
}

Assistant:

double Expr::operator()(Environment& env) const {
    return detail::eval_ast(env, ast);
}